

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O0

JDIMENSION jpeg_read_raw_data(j_decompress_ptr cinfo,JSAMPIMAGE data,JDIMENSION max_lines)

{
  int iVar1;
  JDIMENSION lines_per_iMCU_row;
  JDIMENSION max_lines_local;
  JSAMPIMAGE data_local;
  j_decompress_ptr cinfo_local;
  
  if (cinfo->global_state != 0xce) {
    cinfo->err->msg_code = 0x15;
    (cinfo->err->msg_parm).i[0] = cinfo->global_state;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->output_scanline < cinfo->output_height) {
    if (cinfo->progress != (jpeg_progress_mgr *)0x0) {
      cinfo->progress->pass_counter = (ulong)cinfo->output_scanline;
      cinfo->progress->pass_limit = (ulong)cinfo->output_height;
      (*cinfo->progress->progress_monitor)((j_common_ptr)cinfo);
    }
    cinfo_local._4_4_ = cinfo->max_v_samp_factor * cinfo->min_DCT_v_scaled_size;
    if (max_lines < cinfo_local._4_4_) {
      cinfo->err->msg_code = 0x18;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    iVar1 = (*cinfo->coef->decompress_data)(cinfo,data);
    if (iVar1 == 0) {
      cinfo_local._4_4_ = 0;
    }
    else {
      cinfo->output_scanline = cinfo_local._4_4_ + cinfo->output_scanline;
    }
  }
  else {
    cinfo->err->msg_code = 0x7e;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
    cinfo_local._4_4_ = 0;
  }
  return cinfo_local._4_4_;
}

Assistant:

GLOBAL(JDIMENSION)
jpeg_read_raw_data (j_decompress_ptr cinfo, JSAMPIMAGE data,
		    JDIMENSION max_lines)
{
  JDIMENSION lines_per_iMCU_row;

  if (cinfo->global_state != DSTATE_RAW_OK)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  if (cinfo->output_scanline >= cinfo->output_height) {
    WARNMS(cinfo, JWRN_TOO_MUCH_DATA);
    return 0;
  }

  /* Call progress monitor hook if present */
  if (cinfo->progress != NULL) {
    cinfo->progress->pass_counter = (long) cinfo->output_scanline;
    cinfo->progress->pass_limit = (long) cinfo->output_height;
    (*cinfo->progress->progress_monitor) ((j_common_ptr) cinfo);
  }

  /* Verify that at least one iMCU row can be returned. */
  lines_per_iMCU_row = cinfo->max_v_samp_factor * cinfo->min_DCT_v_scaled_size;
  if (max_lines < lines_per_iMCU_row)
    ERREXIT(cinfo, JERR_BUFFER_SIZE);

  /* Decompress directly into user's buffer. */
  if (! (*cinfo->coef->decompress_data) (cinfo, data))
    return 0;			/* suspension forced, can do nothing more */

  /* OK, we processed one iMCU row. */
  cinfo->output_scanline += lines_per_iMCU_row;
  return lines_per_iMCU_row;
}